

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void update_tied_regs(gen_ctx_t gen_ctx,MIR_reg_t reg)

{
  char *pcVar1;
  
  if (reg < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5f3,"void update_tied_regs(gen_ctx_t, MIR_reg_t)");
  }
  if (reg != 0xffffffff) {
    pcVar1 = MIR_reg_hard_reg_name(gen_ctx->ctx,reg - 0x21,(gen_ctx->curr_func_item->u).func);
    if (pcVar1 != (char *)0x0) {
      bitmap_set_bit_p(gen_ctx->tied_regs,(ulong)reg);
      return;
    }
  }
  return;
}

Assistant:

static void update_tied_regs (gen_ctx_t gen_ctx, MIR_reg_t reg) {
  gen_assert (reg > MAX_HARD_REG);
  if (reg == MIR_NON_VAR
      || MIR_reg_hard_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, curr_func_item->u.func) == NULL)
    return;
  bitmap_set_bit_p (tied_regs, reg);
}